

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::Delay3Control::fromSyntax
          (Compilation *compilation,Delay3Syntax *syntax,ASTContext *context)

{
  Expression *__addr;
  bool bVar1;
  int iVar2;
  BumpAllocator *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Delay3Control *pDVar3;
  Expression *in_RDX;
  long in_RSI;
  Compilation *in_RDI;
  anon_class_8_1_bc11688f checkType;
  Delay3Control *result;
  Expression *expr3;
  Expression *expr2;
  Expression *expr1;
  TimingControl *in_stack_ffffffffffffff48;
  Compilation *compilation_00;
  SourceRange *in_stack_ffffffffffffff60;
  Expression *in_stack_ffffffffffffff68;
  Expression *in_stack_ffffffffffffff70;
  Expression *in_stack_ffffffffffffff78;
  SyntaxNode *local_68;
  bitmask<slang::ast::ASTFlags> local_50;
  long local_48;
  bitmask<slang::ast::ASTFlags> local_40;
  long local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  undefined8 local_28;
  Expression *local_20;
  long local_18;
  Compilation *local_10;
  Delay3Control *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  this = (BumpAllocator *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x4bec50);
  __addr = local_20;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,None);
  iVar2 = Expression::bind((int)this,(sockaddr *)__addr,(socklen_t)local_30.m_bits);
  local_28 = CONCAT44(extraout_var,iVar2);
  local_38 = 0;
  if (*(long *)(local_18 + 0x50) != 0) {
    in_stack_ffffffffffffff70 = *(Expression **)(local_18 + 0x50);
    in_stack_ffffffffffffff78 = local_20;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_40,None);
    iVar2 = Expression::bind((int)in_stack_ffffffffffffff70,(sockaddr *)in_stack_ffffffffffffff78,
                             (socklen_t)local_40.m_bits);
    local_38 = CONCAT44(extraout_var_00,iVar2);
  }
  local_48 = 0;
  if (*(long *)(local_18 + 0x68) != 0) {
    in_stack_ffffffffffffff60 = *(SourceRange **)(local_18 + 0x68);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_50,None);
    iVar2 = Expression::bind((int)in_stack_ffffffffffffff60,(sockaddr *)local_20,
                             (socklen_t)local_50.m_bits);
    local_48 = CONCAT44(extraout_var_01,iVar2);
    in_stack_ffffffffffffff68 = local_20;
  }
  slang::syntax::SyntaxNode::sourceRange(local_68);
  pDVar3 = BumpAllocator::
           emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                     (this,in_stack_ffffffffffffff78,(Expression **)in_stack_ffffffffffffff70,
                      (Expression **)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  bVar1 = Expression::bad((Expression *)local_10);
  compilation_00 = local_10;
  if (((bVar1) ||
      ((local_38 != 0 &&
       (bVar1 = Expression::bad((Expression *)local_10), compilation_00 = local_10, bVar1)))) ||
     ((local_48 != 0 && (bVar1 = Expression::bad((Expression *)compilation_00), bVar1)))) {
    local_8 = (Delay3Control *)TimingControl::badCtrl(compilation_00,in_stack_ffffffffffffff48);
  }
  else {
    bVar1 = fromSyntax::anon_class_8_1_bc11688f::operator()
                      ((anon_class_8_1_bc11688f *)in_stack_ffffffffffffff78,
                       in_stack_ffffffffffffff70);
    if (((!bVar1) ||
        ((local_38 != 0 &&
         (bVar1 = fromSyntax::anon_class_8_1_bc11688f::operator()
                            ((anon_class_8_1_bc11688f *)in_stack_ffffffffffffff78,
                             in_stack_ffffffffffffff70), !bVar1)))) ||
       ((local_8 = pDVar3, local_48 != 0 &&
        (bVar1 = fromSyntax::anon_class_8_1_bc11688f::operator()
                           ((anon_class_8_1_bc11688f *)in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff70), !bVar1)))) {
      local_8 = (Delay3Control *)TimingControl::badCtrl(compilation_00,in_stack_ffffffffffffff48);
    }
  }
  return &local_8->super_TimingControl;
}

Assistant:

TimingControl& Delay3Control::fromSyntax(Compilation& compilation, const Delay3Syntax& syntax,
                                         const ASTContext& context) {
    auto& expr1 = Expression::bind(*syntax.delay1, context);

    const Expression* expr2 = nullptr;
    if (syntax.delay2)
        expr2 = &Expression::bind(*syntax.delay2, context);

    const Expression* expr3 = nullptr;
    if (syntax.delay3)
        expr3 = &Expression::bind(*syntax.delay3, context);

    auto result = compilation.emplace<Delay3Control>(expr1, expr2, expr3, syntax.sourceRange());
    if (expr1.bad() || (expr2 && expr2->bad()) || (expr3 && expr3->bad()))
        return badCtrl(compilation, result);

    auto checkType = [&](const Expression& expr) {
        if (!expr.type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
            return false;
        }
        return true;
    };

    if (!checkType(expr1) || (expr2 && !checkType(*expr2)) || (expr3 && !checkType(*expr3)))
        return badCtrl(compilation, result);

    return *result;
}